

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O0

Gia_Man_t * Gia_ManUnrollInit(Gia_Man_t *p,int nFrames)

{
  int iVar1;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pObj_00;
  bool bVar3;
  int local_40;
  int local_3c;
  int i;
  int f;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFill(&p->vCopies,nFrames * iVar1,-1);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(nFrames * iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  Gia_ManHashAlloc(p_00);
  local_40 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar3 = false;
    if (local_40 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pObjRi = Gia_ManCi(p,iVar1 + local_40);
      bVar3 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Gia_ObjSetCopyF(p,0,pObjRi,0);
    local_40 = local_40 + 1;
  }
  for (local_3c = 0; local_3c < nFrames; local_3c = local_3c + 1) {
    pObj_00 = Gia_ManConst0(p);
    Gia_ObjSetCopyF(p,local_3c,pObj_00,0);
    local_40 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar3 = false;
      if (local_40 < iVar1) {
        pObjRi = Gia_ManCi(p,local_40);
        bVar3 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ManAppendCi(p_00);
      Gia_ObjSetCopyF(p,local_3c,pObjRi,iVar1);
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      bVar3 = false;
      if (local_40 < p->nObjs) {
        pObjRi = Gia_ManObj(p,local_40);
        bVar3 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjIsAnd(pObjRi);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0CopyF(p,local_3c,pObjRi);
        iLit1 = Gia_ObjFanin1CopyF(p,local_3c,pObjRi);
        iVar1 = Gia_ManHashAnd(p_00,iVar1,iLit1);
        Gia_ObjSetCopyF(p,local_3c,pObjRi,iVar1);
      }
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar3 = false;
      if (local_40 < iVar1) {
        pObjRi = Gia_ManCo(p,local_40);
        bVar3 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjFanin0CopyF(p,local_3c,pObjRi);
      Gia_ObjSetCopyF(p,local_3c,pObjRi,iVar1);
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar3 = false;
      if (local_40 < iVar1) {
        pObjRi = Gia_ManCo(p,local_40);
        bVar3 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjCopyF(p,local_3c,pObjRi);
      Gia_ManAppendCo(p_00,iVar1);
      local_40 = local_40 + 1;
    }
    if (local_3c == nFrames + -1) break;
    local_40 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar3 = false;
      if (local_40 < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar1 + local_40);
        bVar3 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar1 = Gia_ManPiNum(p);
          _i = Gia_ManCi(p,iVar1 + local_40);
          bVar3 = _i != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjCopyF(p,local_3c,pObjRo);
      Gia_ObjSetCopyF(p,local_3c + 1,_i,iVar1);
      local_40 = local_40 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManUnrollInit( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int f, i;
    Vec_IntFill( &p->vCopies, nFrames * Gia_ManObjNum(p), -1 );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, 0 );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
        Gia_ManForEachAnd( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManHashAnd(pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj)) );
        Gia_ManForEachCo( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ObjFanin0CopyF(p, f, pObj) );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjCopyF(p, f, pObj) );
        if ( f == nFrames - 1 )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Gia_ObjSetCopyF( p, f+1, pObjRo, Gia_ObjCopyF(p, f, pObjRi) );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}